

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderInterfaceCompatibility.cpp
# Opt level: O1

void __thiscall
Rml::RenderInterfaceAdapter::RenderToClipMask
          (RenderInterfaceAdapter *this,ClipMaskOperation operation,CompiledGeometryHandle handle,
          Vector2f translation)

{
  Vector2f VVar1;
  Vector2f *pVVar2;
  Vector2f VVar3;
  Vector2f a;
  const_iterator __begin1;
  Vector2f *pVVar4;
  float fVar5;
  float fVar6;
  float local_48;
  float fStack_44;
  
  if (operation == SetInverse) {
    return;
  }
  pVVar4 = *(Vector2f **)handle;
  pVVar2 = *(Vector2f **)(handle + 8);
  fVar5 = (*pVVar4).x;
  fVar6 = (*pVVar4).y;
  local_48 = fVar5;
  fStack_44 = fVar6;
  for (; pVVar4 != pVVar2; pVVar4 = (Vector2f *)&pVVar4[2].y) {
    VVar1 = *pVVar4;
    VVar3.y = fStack_44;
    VVar3.x = local_48;
    VVar3 = Math::Min<Rml::Vector2<float>>(VVar3,VVar1);
    a.y = fVar6;
    a.x = fVar5;
    VVar1 = Math::Max<Rml::Vector2<float>>(a,VVar1);
    fVar5 = VVar1.x;
    fVar6 = VVar1.y;
    local_48 = VVar3.x;
    fStack_44 = VVar3.y;
  }
  (*this->legacy->_vptr_RenderInterfaceCompatibility[7])();
  return;
}

Assistant:

void RenderInterfaceAdapter::RenderToClipMask(ClipMaskOperation operation, CompiledGeometryHandle handle, Vector2f translation)
{
	switch (operation)
	{
	case ClipMaskOperation::Set:
	case ClipMaskOperation::Intersect:
		// Intersect is considered like Set. This typically occurs in nested clipping situations, which never worked
		// correctly in legacy.
		break;
	case ClipMaskOperation::SetInverse:
		// Using features not supported in legacy, bail out.
		return;
	}

	// New features can render more complex clip masks, while legacy only supported rectangle scissoring. Find the
	// geometry's rectangular coverage.
	const AdaptedGeometry* geometry = reinterpret_cast<AdaptedGeometry*>(handle);

	Rectanglef rectangle = Rectanglef::FromPosition(geometry->vertices[0].position);
	for (const Vertex& vertex : geometry->vertices)
		rectangle = rectangle.Join(vertex.position);

	const Rectanglei scissor = Rectanglei(rectangle.Translate(translation));
	legacy.SetScissorRegion(scissor.Left(), scissor.Top(), scissor.Width(), scissor.Height());
}